

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

void Kf_SetMergeOrder(Kf_Set_t *p,int *pCuts0,int *pCuts1,int fArea,int fCutMin)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int *piVar9;
  Kf_Cut_t *pKVar10;
  Kf_Cut_t *pKVar11;
  int iVar12;
  Kf_Cut_t *pKVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  Kf_Cut_t *pBase;
  int iVar19;
  int *local_88;
  int *local_70;
  
  Kf_SetPrepare(p,pCuts0,pCuts1);
  iVar19 = p->nCuts0;
  iVar3 = p->nCuts1;
  p->CutCount[0] = p->CutCount[0] + (long)(iVar3 * iVar19);
  local_88 = p->pCuts0[0].pLeaves;
  pKVar10 = p->pCuts0;
  do {
    pKVar13 = p->pCuts1;
    local_70 = p->pCuts1[0].pLeaves;
    if (p->pCuts0 + iVar19 <= pKVar10) {
      if (p->nCuts < 1) {
        __assert_fail("p->nCuts > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                      ,0x2f0,"void Kf_SetFilterOrder(Kf_Set_t *)");
      }
      uVar5 = 0;
LAB_005e9515:
      if (p->nLutSize < uVar5) {
        iVar19 = p->nCuts;
        if (0 < iVar19) {
          iVar3 = p->nCutNum - 1;
          if (iVar19 < iVar3) {
            iVar3 = iVar19;
          }
          p->CutCount[3] = p->CutCount[3] + (long)iVar3;
          Kf_SetSelectBest(p,fArea,(int)pKVar10);
          return;
        }
        __assert_fail("p->nCuts > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                      ,0x2fd,"void Kf_SetFilterOrder(Kf_Set_t *)");
      }
      pKVar13 = (Kf_Cut_t *)(p->pList + uVar5);
LAB_005e9532:
      pKVar10 = pKVar13;
      uVar4 = (uint)pKVar10->Sign;
      do {
        pKVar11 = p->pCutsR + uVar4;
        if ((int)uVar4 < 0) {
          uVar5 = uVar5 + 1;
          goto LAB_005e9515;
        }
        for (iVar19 = 0; iVar19 < pKVar11->nLeaves; iVar19 = iVar19 + 1) {
          piVar9 = p->pList + iVar19;
          while (-1 < (long)*piVar9) {
            pKVar13 = p->pCutsR + *piVar9;
            if (((pKVar13->Sign & ~pKVar11->Sign) == 0) &&
               (iVar3 = Kf_SetCutIsContainedOrder(pKVar11,pKVar13), iVar3 != 0)) {
              iVar19 = pKVar11->nLeaves;
              p->nCuts = p->nCuts + -1;
              break;
            }
            piVar9 = &pKVar13->iNext;
          }
        }
        pKVar13 = (Kf_Cut_t *)&pKVar11->iNext;
        if (iVar19 != pKVar11->nLeaves + 1) goto LAB_005e9532;
        uVar4 = pKVar11->iNext;
        *(uint *)&pKVar10->Sign = uVar4;
      } while( true );
    }
    for (; pKVar13 < p->pCuts1 + iVar3; pKVar13 = pKVar13 + 1) {
      uVar4 = pKVar10->nLeaves;
      uVar14 = pKVar13->nLeaves;
      uVar8 = (uint)p->nLutSize;
      if (((int)(uVar4 + uVar14) <= (int)(uint)p->nLutSize) ||
         (uVar5 = pKVar13->Sign | pKVar10->Sign, uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555),
         uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333),
         (byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) <= uVar8)) {
        p->CutCount[1] = p->CutCount[1] + 1;
        iVar19 = p->nCuts;
        pKVar11 = p->pCutsR + iVar19;
        if ((uVar4 == uVar8) && (uVar14 == uVar8)) {
          for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
            if (local_88[uVar5] != local_70[uVar5]) goto LAB_005e944a;
            pKVar11->pLeaves[uVar5] = local_88[uVar5];
          }
        }
        else {
          lVar7 = (long)(int)uVar14;
          lVar15 = 0;
          iVar3 = 0;
          uVar5 = 0;
LAB_005e92a6:
          iVar12 = (int)uVar5;
          uVar2 = (uint)lVar15;
          lVar6 = 0;
          uVar17 = uVar2;
          while( true ) {
            uVar17 = uVar17 + 1;
            if ((ulong)uVar8 - lVar15 == lVar6) goto LAB_005e944a;
            iVar16 = pKVar10->pLeaves[iVar3];
            iVar1 = local_70[iVar12 + lVar6];
            iVar18 = (int)lVar6;
            if (iVar16 < iVar1) {
              p->pCutsR[iVar19].pLeaves[lVar15 + lVar6] = iVar16;
              if (iVar3 + 1 < (int)uVar4) {
                uVar5 = (ulong)(uint)(iVar12 + iVar18);
                goto LAB_005e935e;
              }
              iVar12 = iVar12 + iVar18;
              goto LAB_005e94a4;
            }
            if (iVar16 <= iVar1) break;
            p->pCutsR[iVar19].pLeaves[lVar15 + lVar6] = iVar1;
            lVar6 = lVar6 + 1;
            iVar16 = iVar3;
            if ((int)uVar14 <= (int)lVar6 + iVar12) goto LAB_005e9436;
          }
          p->pCutsR[iVar19].pLeaves[lVar15 + lVar6] = iVar16;
          if ((int)uVar4 <= iVar3 + 1) {
            iVar12 = iVar12 + iVar18 + 1;
LAB_005e94a4:
            if ((int)(uVar14 + uVar2 + iVar18 + 1) <= (int)(uVar8 + iVar12)) {
              piVar9 = p->pCutsR[iVar19].pLeaves + uVar17;
              uVar14 = uVar17;
              for (lVar15 = (long)iVar12; lVar15 < lVar7; lVar15 = lVar15 + 1) {
                *piVar9 = local_70[lVar15];
                uVar14 = uVar14 + 1;
                piVar9 = piVar9 + 1;
              }
              goto LAB_005e9378;
            }
            goto LAB_005e944a;
          }
          uVar5 = (uVar5 & 0xffffffff) + lVar6 + 1;
          iVar16 = iVar3 + 1;
          if ((int)uVar5 < (int)uVar14) goto LAB_005e935e;
LAB_005e9436:
          if ((int)(uVar8 + iVar16) < (int)(iVar18 + uVar2 + uVar4 + 1)) goto LAB_005e944a;
          piVar9 = p->pCutsR[iVar19].pLeaves + uVar17;
          uVar14 = uVar17;
          for (lVar7 = (long)iVar16; lVar7 < (int)uVar4; lVar7 = lVar7 + 1) {
            *piVar9 = local_88[lVar7];
            uVar14 = uVar14 + 1;
            piVar9 = piVar9 + 1;
          }
        }
LAB_005e9378:
        pKVar11->nLeaves = uVar14;
        p->CutCount[2] = p->CutCount[2] + 1;
        pKVar11->Sign = pKVar13->Sign | pKVar10->Sign;
        piVar9 = p->pList + (int)uVar14;
        while (-1 < (long)*piVar9) {
          pBase = p->pCutsR + *piVar9;
          if ((pBase->Sign == pKVar11->Sign) &&
             (iVar3 = Kf_SetCutIsContainedOrder(pBase,pKVar11), iVar3 != 0)) goto LAB_005e944a;
          piVar9 = &pBase->iNext;
        }
        p->nCuts = p->nCuts + 1;
        lVar7 = (long)pKVar11->nLeaves;
        if (lVar7 < 2) {
          __assert_fail("pCutR->nLeaves > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                        ,0x330,"void Kf_SetMergeOrder(Kf_Set_t *, int *, int *, int, int)");
        }
        iVar3 = pKVar13->Delay;
        if (pKVar13->Delay < pKVar10->Delay) {
          iVar3 = pKVar10->Delay;
        }
        pKVar11->Delay = iVar3;
        pKVar11->Area = pKVar10->Area + pKVar13->Area;
        pKVar11->iNext = p->pList[lVar7];
        p->pList[lVar7] = iVar19;
      }
LAB_005e944a:
      iVar3 = p->nCuts1;
      local_70 = local_70 + 0x18;
    }
    pKVar10 = pKVar10 + 1;
    iVar19 = p->nCuts0;
    local_88 = local_88 + 0x18;
  } while( true );
LAB_005e935e:
  iVar3 = iVar3 + 1;
  lVar15 = lVar15 + lVar6 + 1;
  goto LAB_005e92a6;
}

Assistant:

static inline void Kf_SetMergeOrder( Kf_Set_t * p, int * pCuts0, int * pCuts1, int fArea, int fCutMin )
{
    Kf_Cut_t * pCut0, * pCut1, * pCutR;
    Kf_SetPrepare( p, pCuts0, pCuts1 );
    p->CutCount[0] += p->nCuts0 * p->nCuts1;
    for ( pCut0 = p->pCuts0; pCut0 < p->pCuts0 + p->nCuts0; pCut0++ )
    for ( pCut1 = p->pCuts1; pCut1 < p->pCuts1 + p->nCuts1; pCut1++ )
    {
        if ( pCut0->nLeaves + pCut1->nLeaves > p->nLutSize && Kf_SetCountBits(pCut0->Sign | pCut1->Sign) > p->nLutSize )
            continue;
        p->CutCount[1]++;        
        pCutR = p->pCutsR + p->nCuts;
        if ( !Kf_SetMergeOrderOne(pCut0, pCut1, pCutR, p->nLutSize) )
            continue;
        p->CutCount[2]++;        
        pCutR->Sign = pCut0->Sign | pCut1->Sign;
        if ( Kf_SetRemoveDuplicatesOrder(p, pCutR) )
            continue;
        p->nCuts++;
        if ( fCutMin )
        {
            int nOldSupp = pCutR->nLeaves;
//            pCutR->iFunc = Kf_SetComputeTruth( p, pCut0->iFunc, pCut1->iFunc, pCut0, pCut1, pCutR );
            assert( pCutR->nLeaves <= nOldSupp );
            if ( pCutR->nLeaves < nOldSupp )
                pCutR->Sign = Kf_SetCutGetSign( pCutR );
            // delay and area are inaccurate
        }
        assert( pCutR->nLeaves > 1 );
        pCutR->Delay = Abc_MaxInt(pCut0->Delay, pCut1->Delay);
        pCutR->Area  = pCut0->Area + pCut1->Area;
        // add new cut
        Kf_SetAddToList( p, pCutR, 0 );
    }
    Kf_SetFilterOrder( p );
//    Kf_CheckCuts( p );
    p->CutCount[3] += Abc_MinInt( p->nCuts, p->nCutNum-1 );
    Kf_SetSelectBest( p, fArea, 1 );
}